

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFutureCompletionBaseHeaderEXT *value)

{
  bool bVar1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_130;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [8];
  string error_str_1;
  XrWorldMeshRequestCompletionML *new_value_1;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [8];
  string error_str;
  XrWorldMeshStateRequestCompletionML *new_value;
  XrResult xr_result;
  XrFutureCompletionBaseHeaderEXT *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if (value->type == XR_TYPE_WORLD_MESH_STATE_REQUEST_COMPLETION_ML) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_ML_world_mesh_detection"),
       !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_68,"XrFutureCompletionBaseHeaderEXT being used with child struct type ",
                 &local_69);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      std::__cxx11::string::operator+=
                (local_68,"\"XR_TYPE_WORLD_MESH_STATE_REQUEST_COMPLETION_ML\"");
      std::__cxx11::string::operator+=
                (local_68,
                 " which requires extension \"XR_ML_world_mesh_detection\" to be enabled, but it is not enabled"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"VUID-XrFutureCompletionBaseHeaderEXT-type-type",&local_a1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_1,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_value_1,(string *)local_68);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_1);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_68);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrWorldMeshStateRequestCompletionML *)value);
  }
  else if (value->type == XR_TYPE_WORLD_MESH_REQUEST_COMPLETION_ML) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_ML_world_mesh_detection"),
       !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e8,"XrFutureCompletionBaseHeaderEXT being used with child struct type ",
                 &local_e9);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      std::__cxx11::string::operator+=(local_e8,"\"XR_TYPE_WORLD_MESH_REQUEST_COMPLETION_ML\"");
      std::__cxx11::string::operator+=
                (local_e8,
                 " which requires extension \"XR_ML_world_mesh_detection\" to be enabled, but it is not enabled"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_110,"VUID-XrFutureCompletionBaseHeaderEXT-type-type",&local_111);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_130,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_110,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_130,(string *)local_e8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_130);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::__cxx11::string::~string(local_e8);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrWorldMeshRequestCompletionML *)value);
  }
  else {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFutureCompletionBaseHeaderEXT",value->type
               ,"VUID-XrFutureCompletionBaseHeaderEXT-type-type",XR_TYPE_UNKNOWN,"");
    instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFutureCompletionBaseHeaderEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrFutureCompletionBaseHeaderEXT-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrFutureCompletionBaseHeaderEXT-next-next" because it is a base structure
    // NOTE: Can't validate "VUID-XrFutureCompletionBaseHeaderEXT-futureResult-parameter" because it is a base structure
    if (value->type == XR_TYPE_WORLD_MESH_STATE_REQUEST_COMPLETION_ML) {
        const XrWorldMeshStateRequestCompletionML* new_value = reinterpret_cast<const XrWorldMeshStateRequestCompletionML*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_world_mesh_detection")) {
            std::string error_str = "XrFutureCompletionBaseHeaderEXT being used with child struct type ";
            error_str += "\"XR_TYPE_WORLD_MESH_STATE_REQUEST_COMPLETION_ML\"";
            error_str += " which requires extension \"XR_ML_world_mesh_detection\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrFutureCompletionBaseHeaderEXT-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_WORLD_MESH_REQUEST_COMPLETION_ML) {
        const XrWorldMeshRequestCompletionML* new_value = reinterpret_cast<const XrWorldMeshRequestCompletionML*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_world_mesh_detection")) {
            std::string error_str = "XrFutureCompletionBaseHeaderEXT being used with child struct type ";
            error_str += "\"XR_TYPE_WORLD_MESH_REQUEST_COMPLETION_ML\"";
            error_str += " which requires extension \"XR_ML_world_mesh_detection\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrFutureCompletionBaseHeaderEXT-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    InvalidStructureType(instance_info, command_name, objects_info, "XrFutureCompletionBaseHeaderEXT",
                         value->type, "VUID-XrFutureCompletionBaseHeaderEXT-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}